

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O2

void __thiscall mp::SPAdapter::ProcessObjs(SPAdapter *this)

{
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  *this_00;
  double dVar1;
  int iVar2;
  ColProblem *pCVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pBVar6;
  pointer piVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  NumericConstant NVar11;
  Error *pEVar12;
  long lVar13;
  ulong uVar14;
  ExprBase e;
  ulong uVar15;
  vector<double,_std::allocator<double>_> core_obj;
  BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes> local_58;
  SPAdapter *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  double local_40;
  undefined8 uStack_38;
  
  iVar8 = (int)(((long)(this->problem_->super_Problem).linear_objs_.
                       super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->problem_->super_Problem).linear_objs_.
                      super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x78);
  if (iVar8 != 0) {
    iVar9 = *(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = &this->nonlinear_objs_;
    std::
    vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
    ::reserve(this_00,(long)iVar8);
    pCVar3 = this->problem_;
    pLVar4 = (pCVar3->super_Problem).linear_objs_.
             super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar5 = (pCVar3->super_Problem).linear_objs_.
             super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar14 = 0; (((long)pLVar4 - (long)pLVar5) / 0x78 & 0xffffffffU) != uVar14;
        uVar14 = uVar14 + 1) {
      pBVar6 = (pCVar3->super_Problem).nonlinear_objs_.
               super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar14 < (ulong)((long)(pCVar3->super_Problem).nonlinear_objs_.
                                 super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6 >> 3)) {
        local_58._vptr_BasicExprVisitor = (_func_int **)pBVar6[uVar14].super_ExprBase.impl_;
      }
      else {
        local_58._vptr_BasicExprVisitor = (_func_int **)0x0;
      }
      std::
      vector<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,std::allocator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
      ::emplace_back<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                ((vector<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,std::allocator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
                  *)this_00,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_58);
    }
    pCVar3 = this->problem_;
    uVar14 = (ulong)((long)(this->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2;
    iVar8 = (int)uVar14;
    std::vector<double,_std::allocator<double>_>::vector
              (&core_obj,(long)iVar8,(allocator_type *)&local_58);
    pLVar4 = (pCVar3->super_Problem).linear_objs_.
             super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = *(int **)&(pLVar4->terms_).
                        super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>;
    piVar7 = (this->var_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar13 = *(size_ty *)
                   ((long)&(pLVar4->terms_).
                           super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> + 0x10)
                  << 4; lVar13 != 0; lVar13 = lVar13 + -0x10) {
      iVar2 = piVar7[*piVar10];
      dVar1 = *(double *)(piVar10 + 2);
      if ((iVar9 <= iVar2) && ((dVar1 != 0.0 || (NAN(dVar1))))) {
        pEVar12 = (Error *)__cxa_allocate_exception(0x18);
        Error::Error(pEVar12,(CStringRef)0x1559da,-1);
        __cxa_throw(pEVar12,&Error::typeinfo,fmt::SystemError::~SystemError);
      }
      core_obj.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar2] = dVar1;
      piVar10 = piVar10 + 4;
    }
    pBVar6 = (pCVar3->super_Problem).nonlinear_objs_.
             super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((pCVar3->super_Problem).nonlinear_objs_.
         super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
         ._M_impl.super__Vector_impl_data._M_finish != pBVar6) &&
       (e.impl_ = (pBVar6->super_ExprBase).impl_, e.impl_ != (Impl *)0x0)) {
      if ((e.impl_)->kind_ == CALL) {
        iVar9 = strcmp((char *)(*(long *)(e.impl_ + 2) + 8),"expectation");
        if (iVar9 == 0) {
          if ((e.impl_[4].kind_ != FIRST_EXPR) ||
             (e.impl_ = *(Impl **)(e.impl_ + 6), (e.impl_)->kind_ - BOOL < 0xffffffd1)) {
            pEVar12 = (Error *)__cxa_allocate_exception(0x18);
            Error::Error(pEVar12,(CStringRef)0x155b3c,-1);
            __cxa_throw(pEVar12,&Error::typeinfo,fmt::SystemError::~SystemError);
          }
          (((this_00->
            super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
            )._M_impl.super__Vector_impl_data._M_start)->super_ExprBase).impl_ = (Impl *)0x0;
        }
      }
      local_58._vptr_BasicExprVisitor = (_func_int **)&PTR__BasicExprVisitor_001886a8;
      local_40 = 0.0;
      uStack_38 = 0x3ff0000000000000;
      local_50 = this;
      local_48 = &core_obj;
      BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>::Visit
                (&local_58,(Expr)e.impl_);
      if ((local_40 != 0.0) || (NAN(local_40))) {
        NVar11 = BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                           (&this->factory_,local_40);
        (((this_00->
          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
          )._M_impl.super__Vector_impl_data._M_start)->super_ExprBase).impl_ =
             (Impl *)NVar11.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                     impl_;
      }
    }
    uVar15 = 0;
    uVar14 = uVar14 & 0xffffffff;
    if (iVar8 < 1) {
      uVar14 = uVar15;
    }
    for (; uVar14 != uVar15; uVar15 = uVar15 + 1) {
      dVar1 = core_obj.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        LinearExpr::AddTerm(&this->linear_obj_,(int)uVar15,dVar1);
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&core_obj.super__Vector_base<double,_std::allocator<double>_>);
  }
  return;
}

Assistant:

void SPAdapter::ProcessObjs() {
  int num_objs = problem_.num_objs();
  if (num_objs == 0)
    return;
  int num_stage1_vars = num_stage_vars_[0];
  nonlinear_objs_.reserve(num_objs);
  auto objs = problem_.objs();
  for (auto i = objs.begin(), end = objs.end(); i != end; ++i)
    nonlinear_objs_.push_back(i->nonlinear_expr());
  // Strip expectation from the first objective.
  auto obj = problem_.obj(0);
  int num_vars = this->num_vars();
  std::vector<double> core_obj(num_vars);
  const auto &linear = obj.linear_expr();
  for (auto i = linear.begin(), end = linear.end(); i != end; ++i) {
    int core_var_index = var_orig2core_[i->var_index()];
    if (core_var_index >= num_stage1_vars && i->coef() != 0)
      throw Error("second-stage variable outside of expectation in objective");
    core_obj[core_var_index] = i->coef();
  }
  auto obj_expr = obj.nonlinear_expr();
  if (obj_expr) {
    auto call = Cast<CallExpr>(obj_expr);
    if (call && std::strcmp(call.function().name(), "expectation") == 0) {
      if (call.num_args() != 1 || !(obj_expr = Cast<NumericExpr>(call.arg(0))))
        throw Error("invalid arguments to expectation");
      nonlinear_objs_[0] = mp::NumericExpr();
    }
    internal::AffineExprExtractor extractor(*this, core_obj);
    extractor.Visit(obj_expr);
    if (auto constant = extractor.constant())
      nonlinear_objs_[0] = factory_.MakeNumericConstant(constant);
  }
  for (int i = 0; i < num_vars; ++i) {
    if (auto obj = core_obj[i])
      linear_obj_.AddTerm(i, obj);
  }
}